

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

void ImStb::stb_text_makeundo_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,int where,int old_length,
               int new_length)

{
  ImWchar IVar1;
  ImWchar *pIVar2;
  ulong uVar3;
  ulong uVar4;
  
  pIVar2 = stb_text_createundo(&state->undostate,where,old_length,new_length);
  if (pIVar2 != (ImWchar *)0x0) {
    uVar4 = 0;
    uVar3 = (ulong)(uint)old_length;
    if (old_length < 1) {
      uVar3 = uVar4;
    }
    for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
      IVar1 = STB_TEXTEDIT_GETCHAR(str,(int)uVar4 + where);
      pIVar2[uVar4] = IVar1;
    }
  }
  return;
}

Assistant:

static void stb_text_makeundo_replace(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int old_length, int new_length)
{
   int i;
   STB_TEXTEDIT_CHARTYPE *p = stb_text_createundo(&state->undostate, where, old_length, new_length);
   if (p) {
      for (i=0; i < old_length; ++i)
         p[i] = STB_TEXTEDIT_GETCHAR(str, where+i);
   }
}